

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O0

ValueLimits
google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum(EnumDescriptor *descriptor)

{
  ValueLimits VVar1;
  int iVar2;
  int iVar3;
  EnumValueDescriptor *pEVar4;
  undefined4 local_34;
  EnumValueDescriptor *pEStack_30;
  int i;
  EnumValueDescriptor *max_desc;
  EnumValueDescriptor *min_desc;
  EnumDescriptor *descriptor_local;
  
  max_desc = EnumDescriptor::value(descriptor,0);
  pEStack_30 = EnumDescriptor::value(descriptor,0);
  local_34 = 1;
  while( true ) {
    iVar2 = EnumDescriptor::value_count(descriptor);
    if (iVar2 <= local_34) break;
    pEVar4 = EnumDescriptor::value(descriptor,local_34);
    iVar2 = EnumValueDescriptor::number(pEVar4);
    iVar3 = EnumValueDescriptor::number(max_desc);
    if (iVar2 < iVar3) {
      max_desc = EnumDescriptor::value(descriptor,local_34);
    }
    pEVar4 = EnumDescriptor::value(descriptor,local_34);
    iVar2 = EnumValueDescriptor::number(pEVar4);
    iVar3 = EnumValueDescriptor::number(pEStack_30);
    if (iVar3 < iVar2) {
      pEStack_30 = EnumDescriptor::value(descriptor,local_34);
    }
    local_34 = local_34 + 1;
  }
  VVar1.max = pEStack_30;
  VVar1.min = max_desc;
  return VVar1;
}

Assistant:

EnumGenerator::ValueLimits EnumGenerator::ValueLimits::FromEnum(
    const EnumDescriptor* descriptor) {
  const EnumValueDescriptor* min_desc = descriptor->value(0);
  const EnumValueDescriptor* max_desc = descriptor->value(0);

  for (int i = 1; i < descriptor->value_count(); ++i) {
    if (descriptor->value(i)->number() < min_desc->number()) {
      min_desc = descriptor->value(i);
    }
    if (descriptor->value(i)->number() > max_desc->number()) {
      max_desc = descriptor->value(i);
    }
  }

  return EnumGenerator::ValueLimits{min_desc, max_desc};
}